

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

optional<bool> SetRPathELF(string *file,string *newRPath,string *emsg,bool *changed)

{
  _Optional_base<bool,_true,_true> _Var1;
  AdjustCallback local_a0;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
  local_70;
  undefined1 local_50 [8];
  anon_class_32_1_393cdf75 adjustCallback;
  bool *changed_local;
  string *emsg_local;
  string *newRPath_local;
  string *file_local;
  
  adjustCallback.newRPath.field_2._8_8_ = changed;
  std::__cxx11::string::string((string *)local_50,(string *)newRPath);
  anon_unknown.dwarf_12ec9::MakeEmptyCallback(&local_70,newRPath);
  std::
  function<bool(std::optional<std::__cxx11::string>&,std::__cxx11::string_const&,char_const*,std::__cxx11::string*)>
  ::
  function<SetRPathELF(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,bool*)::__0&,void>
            ((function<bool(std::optional<std::__cxx11::string>&,std::__cxx11::string_const&,char_const*,std::__cxx11::string*)>
              *)&local_a0,(anon_class_32_1_393cdf75 *)local_50);
  _Var1._M_payload.super__Optional_payload_base<bool> =
       (_Optional_payload<bool,_true,_true,_true>)
       anon_unknown.dwarf_12ec9::AdjustRPathELF
                 (file,&local_70,&local_a0,emsg,(bool *)adjustCallback.newRPath.field_2._8_8_);
  std::
  function<bool_(std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
  ::~function(&local_a0);
  std::
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_cmELF_&)>
  ::~function(&local_70);
  SetRPathELF(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*,bool*)::
  $_0::~__0((__0 *)local_50);
  return (_Optional_base<bool,_true,_true>)
         (_Optional_base<bool,_true,_true>)_Var1._M_payload.super__Optional_payload_base<bool>;
}

Assistant:

static cm::optional<bool> SetRPathELF(std::string const& file,
                                      std::string const& newRPath,
                                      std::string* emsg, bool* changed)
{
  auto adjustCallback = [newRPath](cm::optional<std::string>& outRPath,
                                   const std::string& inRPath,
                                   const char* /*se_name*/, std::string *
                                   /*emsg*/) -> bool {
    if (inRPath != newRPath) {
      outRPath = newRPath;
    }
    return true;
  };

  return AdjustRPathELF(file, MakeEmptyCallback(newRPath), adjustCallback,
                        emsg, changed);
}